

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O1

void __thiscall fasttext::AutotuneStrategy::updateBest(AutotuneStrategy *this,Args *args)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  loss_name lVar5;
  model_name mVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  bool bVar18;
  bool bVar19;
  undefined2 uVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined5 uVar24;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var25;
  int iVar26;
  double dVar27;
  undefined1 in_XMM2 [16];
  
  if ((AutotuneStrategy *)args != this) {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this,(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)args);
  }
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).input);
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).output);
  (this->bestArgs_).t = args->t;
  dVar27 = args->lr;
  iVar11 = args->lrUpdateRate;
  iVar12 = args->dim;
  iVar13 = args->ws;
  iVar14 = args->epoch;
  iVar15 = args->minCount;
  iVar16 = args->minCountLabel;
  iVar26 = args->wordNgrams;
  lVar5 = args->loss;
  mVar6 = args->model;
  iVar7 = args->bucket;
  iVar8 = args->minn;
  iVar9 = args->maxn;
  iVar10 = args->thread;
  (this->bestArgs_).neg = args->neg;
  (this->bestArgs_).wordNgrams = iVar26;
  (this->bestArgs_).loss = lVar5;
  (this->bestArgs_).model = mVar6;
  (this->bestArgs_).bucket = iVar7;
  (this->bestArgs_).minn = iVar8;
  (this->bestArgs_).maxn = iVar9;
  (this->bestArgs_).thread = iVar10;
  (this->bestArgs_).lr = dVar27;
  (this->bestArgs_).lrUpdateRate = iVar11;
  (this->bestArgs_).dim = iVar12;
  (this->bestArgs_).ws = iVar13;
  (this->bestArgs_).epoch = iVar14;
  (this->bestArgs_).minCount = iVar15;
  (this->bestArgs_).minCountLabel = iVar16;
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).label);
  (this->bestArgs_).verbose = args->verbose;
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).pretrainedVectors);
  bVar18 = args->saveOutput;
  bVar19 = args->saveSubwords;
  uVar20 = *(undefined2 *)&args->field_0x10a;
  iVar7 = args->seed;
  bVar21 = args->qout;
  bVar22 = args->retrain;
  bVar23 = args->qnorm;
  uVar24 = *(undefined5 *)&args->field_0x113;
  sVar2 = args->cutoff;
  sVar3 = args->dsub;
  sVar4 = args->dsub;
  iVar26 = args->factor;
  uVar17 = *(undefined4 *)&args->field_0x12c;
  dVar27 = args->addWo;
  (this->bestArgs_).cutoff = args->cutoff;
  (this->bestArgs_).dsub = sVar4;
  (this->bestArgs_).factor = iVar26;
  *(undefined4 *)&(this->bestArgs_).field_0x12c = uVar17;
  (this->bestArgs_).addWo = dVar27;
  (this->bestArgs_).saveOutput = bVar18;
  (this->bestArgs_).saveSubwords = bVar19;
  *(undefined2 *)&(this->bestArgs_).field_0x10a = uVar20;
  (this->bestArgs_).seed = iVar7;
  (this->bestArgs_).qout = bVar21;
  (this->bestArgs_).retrain = bVar22;
  (this->bestArgs_).qnorm = bVar23;
  *(undefined5 *)&(this->bestArgs_).field_0x113 = uVar24;
  (this->bestArgs_).cutoff = sVar2;
  (this->bestArgs_).dsub = sVar3;
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).autotuneValidationFile);
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).autotuneMetric);
  iVar26 = args->autotuneDuration;
  (this->bestArgs_).autotunePredictions = args->autotunePredictions;
  (this->bestArgs_).autotuneDuration = iVar26;
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).autotuneModelSize);
  _Var25 = std::
           __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     ((this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  iVar26 = (int)((ulong)((long)_Var25._M_current -
                        (long)(this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (_Var25._M_current ==
      (this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar26 = 0;
  }
  this->bestMinnIndex_ = iVar26;
  auVar1 = vcvtusi2sd_avx512f(in_XMM2,args->dsub);
  dVar27 = log2(auVar1._0_8_);
  this->bestDsubExponent_ = (int)dVar27;
  if (args->bucket != 0) {
    this->bestNonzeroBucket_ = args->bucket;
  }
  return;
}

Assistant:

void AutotuneStrategy::updateBest(const Args& args) {
  bestArgs_ = args;
  bestMinnIndex_ = getIndex(args.minn, minnChoices_);
  bestDsubExponent_ = log2(args.dsub);
  if (args.bucket != 0) {
    bestNonzeroBucket_ = args.bucket;
  }
}